

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzfmatrix.h
# Opt level: O0

complex<float> * __thiscall
TPZFMatrix<std::complex<float>_>::operator()
          (TPZFMatrix<std::complex<float>_> *this,int64_t row,int64_t col)

{
  int64_t iVar1;
  long in_RDX;
  long in_RSI;
  TPZBaseMatrix *in_RDI;
  char *in_stack_00000188;
  char *in_stack_00000190;
  size_t in_stack_000003e8;
  char *in_stack_000003f0;
  
  iVar1 = TPZBaseMatrix::Rows(in_RDI);
  if ((in_RSI < iVar1) && (-1 < in_RSI)) {
    iVar1 = TPZBaseMatrix::Cols(in_RDI);
    if ((in_RDX < iVar1) && (-1 < in_RDX)) goto LAB_011510ee;
  }
  Error(in_stack_00000190,in_stack_00000188);
  pzinternal::DebugStopImpl(in_stack_000003f0,in_stack_000003e8);
LAB_011510ee:
  return (complex<float> *)
         (in_RDI[1].super_TPZSavable._vptr_TPZSavable + in_RDX * in_RDI->fRow + in_RSI);
}

Assistant:

inline TVar &TPZFMatrix<TVar>::operator()( const int64_t row, const int64_t col) {
#ifndef PZNODEBUG
    if(row >=  this->Rows() || row<0 || col >=  this->Cols() || col<0) {
        Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        DebugStop();
    }
#endif
    return *(this->fElem+col*this->fRow+row);
}